

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_dqt(j_decompress_ptr cinfo)

{
  byte bVar1;
  byte bVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  JQUANT_TBL *pJVar10;
  long *in_RDI;
  int *_mp;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  JQUANT_TBL *quant_ptr;
  uint tmp;
  int prec;
  int i;
  int n;
  JLONG length;
  j_common_ptr in_stack_ffffffffffffffb0;
  long local_48;
  byte *local_40;
  int local_20;
  long local_18;
  
  puVar3 = (undefined8 *)in_RDI[5];
  local_40 = (byte *)*puVar3;
  local_48 = puVar3[1];
  if (local_48 == 0) {
    iVar7 = (*(code *)puVar3[3])(in_RDI);
    if (iVar7 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  bVar1 = *local_40;
  local_40 = local_40 + 1;
  if (local_48 == 0) {
    iVar7 = (*(code *)puVar3[3])(in_RDI);
    if (iVar7 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  bVar2 = *local_40;
  local_40 = local_40 + 1;
  lVar4 = (ulong)bVar2 + (ulong)bVar1 * 0x100 + -2;
  do {
    local_18 = lVar4;
    if (local_18 < 1) {
      if (local_18 != 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0xb;
        (**(code **)*in_RDI)(in_RDI);
      }
      *puVar3 = local_40;
      puVar3[1] = local_48;
      return 1;
    }
    if (local_48 == 0) {
      iVar7 = (*(code *)puVar3[3])(in_RDI);
      if (iVar7 == 0) {
        return 0;
      }
      local_40 = (byte *)*puVar3;
      local_48 = puVar3[1];
    }
    iVar7 = (int)(uint)*local_40 >> 4;
    uVar8 = *local_40 & 0xf;
    *(undefined4 *)(*in_RDI + 0x28) = 0x51;
    *(uint *)(*in_RDI + 0x2c) = uVar8;
    *(int *)(*in_RDI + 0x30) = iVar7;
    (**(code **)(*in_RDI + 8))(in_RDI,1);
    if (3 < uVar8) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1f;
      *(uint *)(*in_RDI + 0x2c) = uVar8;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (in_RDI[(long)(int)uVar8 + 0x19] == 0) {
      pJVar10 = jpeg_alloc_quant_table(in_stack_ffffffffffffffb0);
      in_RDI[(long)(int)uVar8 + 0x19] = (long)pJVar10;
    }
    lVar4 = in_RDI[(long)(int)uVar8 + 0x19];
    local_20 = 0;
    while( true ) {
      local_40 = local_40 + 1;
      local_48 = local_48 + -1;
      if (0x3f < local_20) break;
      if (iVar7 == 0) {
        if (local_48 == 0) {
          iVar9 = (*(code *)puVar3[3])(in_RDI);
          if (iVar9 == 0) {
            return 0;
          }
          local_40 = (byte *)*puVar3;
          local_48 = puVar3[1];
        }
        uVar6 = (ushort)*local_40;
      }
      else {
        if (local_48 == 0) {
          iVar9 = (*(code *)puVar3[3])(in_RDI);
          if (iVar9 == 0) {
            return 0;
          }
          local_40 = (byte *)*puVar3;
          local_48 = puVar3[1];
        }
        local_48 = local_48 + -1;
        bVar1 = *local_40;
        local_40 = local_40 + 1;
        if (local_48 == 0) {
          iVar9 = (*(code *)puVar3[3])(in_RDI);
          if (iVar9 == 0) {
            return 0;
          }
          local_40 = (byte *)*puVar3;
          local_48 = puVar3[1];
        }
        uVar6 = (ushort)*local_40 + (ushort)bVar1 * 0x100;
      }
      *(ushort *)(lVar4 + (long)jpeg_natural_order[local_20] * 2) = uVar6;
      local_20 = local_20 + 1;
    }
    if (1 < *(int *)(*in_RDI + 0x7c)) {
      for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 8) {
        lVar5 = *in_RDI;
        in_stack_ffffffffffffffb0 = (j_common_ptr)(lVar5 + 0x2c);
        *(uint *)&in_stack_ffffffffffffffb0->err = (uint)*(ushort *)(lVar4 + (long)local_20 * 2);
        *(uint *)(lVar5 + 0x30) = (uint)*(ushort *)(lVar4 + (long)(local_20 + 1) * 2);
        *(uint *)(lVar5 + 0x34) = (uint)*(ushort *)(lVar4 + (long)(local_20 + 2) * 2);
        *(uint *)(lVar5 + 0x38) = (uint)*(ushort *)(lVar4 + (long)(local_20 + 3) * 2);
        *(uint *)(lVar5 + 0x3c) = (uint)*(ushort *)(lVar4 + (long)(local_20 + 4) * 2);
        *(uint *)(lVar5 + 0x40) = (uint)*(ushort *)(lVar4 + (long)(local_20 + 5) * 2);
        *(uint *)(lVar5 + 0x44) = (uint)*(ushort *)(lVar4 + (long)(local_20 + 6) * 2);
        *(uint *)(lVar5 + 0x48) = (uint)*(ushort *)(lVar4 + (long)(local_20 + 7) * 2);
        *(undefined4 *)(*in_RDI + 0x28) = 0x5d;
        (**(code **)(*in_RDI + 8))(in_RDI,2);
      }
    }
    lVar4 = local_18 + -0x41;
    if (iVar7 != 0) {
      lVar4 = local_18 + -0x81;
    }
  } while( true );
}

Assistant:

LOCAL(boolean)
get_dqt(j_decompress_ptr cinfo)
/* Process a DQT marker */
{
  JLONG length;
  int n, i, prec;
  unsigned int tmp;
  JQUANT_TBL *quant_ptr;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  while (length > 0) {
    INPUT_BYTE(cinfo, n, return FALSE);
    prec = n >> 4;
    n &= 0x0F;

    TRACEMS2(cinfo, 1, JTRC_DQT, n, prec);

    if (n >= NUM_QUANT_TBLS)
      ERREXIT1(cinfo, JERR_DQT_INDEX, n);

    if (cinfo->quant_tbl_ptrs[n] == NULL)
      cinfo->quant_tbl_ptrs[n] = jpeg_alloc_quant_table((j_common_ptr)cinfo);
    quant_ptr = cinfo->quant_tbl_ptrs[n];

    for (i = 0; i < DCTSIZE2; i++) {
      if (prec)
        INPUT_2BYTES(cinfo, tmp, return FALSE);
      else
        INPUT_BYTE(cinfo, tmp, return FALSE);
      /* We convert the zigzag-order table to natural array order. */
      quant_ptr->quantval[jpeg_natural_order[i]] = (UINT16)tmp;
    }

    if (cinfo->err->trace_level >= 2) {
      for (i = 0; i < DCTSIZE2; i += 8) {
        TRACEMS8(cinfo, 2, JTRC_QUANTVALS,
                 quant_ptr->quantval[i],     quant_ptr->quantval[i + 1],
                 quant_ptr->quantval[i + 2], quant_ptr->quantval[i + 3],
                 quant_ptr->quantval[i + 4], quant_ptr->quantval[i + 5],
                 quant_ptr->quantval[i + 6], quant_ptr->quantval[i + 7]);
      }
    }

    length -= DCTSIZE2 + 1;
    if (prec) length -= DCTSIZE2;
  }

  if (length != 0)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  INPUT_SYNC(cinfo);
  return TRUE;
}